

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::PtexTextureBase::BaseToString_abi_cxx11_(PtexTextureBase *this)

{
  string *in_RDI;
  ColorEncodingHandle *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  bool *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<bool_const&,std::__cxx11::string_const&,pbrt::ColorEncodingHandle_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string PtexTextureBase::BaseToString() const {
    return StringPrintf("valid: %s filename: %s encoding: %s", valid, filename, encoding);
}